

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O3

int __thiscall ncnn::Reshape::forward(Reshape *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  Allocator *pAVar4;
  int *piVar5;
  size_t sVar6;
  int iVar7;
  undefined4 *puVar8;
  void *pvVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined4 *puVar13;
  ulong uVar14;
  ulong uVar15;
  undefined4 *puVar16;
  Mat local_60;
  
  iVar10 = bottom_blob->w;
  iVar12 = bottom_blob->h;
  iVar11 = iVar12 * iVar10 * bottom_blob->c;
  iVar7 = this->ndim;
  if (iVar7 == 3) {
    if (this->w != 0) {
      iVar10 = this->w;
    }
    if (this->h != 0) {
      iVar12 = this->h;
    }
    iVar7 = bottom_blob->c;
    if (this->c != 0) {
      iVar7 = this->c;
    }
    if (iVar10 == -1) {
      iVar10 = (int)((long)((ulong)(uint)((int)((long)iVar11 / (long)iVar7) >> 0x1f) << 0x20 |
                           (long)iVar11 / (long)iVar7 & 0xffffffffU) / (long)iVar12);
    }
    if (iVar12 == -1) {
      iVar12 = (int)((long)((ulong)(uint)((int)((long)iVar11 / (long)iVar7) >> 0x1f) << 0x20 |
                           (long)iVar11 / (long)iVar7 & 0xffffffffU) / (long)iVar10);
    }
    if (iVar7 == -1) {
      iVar7 = (int)((long)((ulong)(uint)((int)((long)iVar11 / (long)iVar12) >> 0x1f) << 0x20 |
                          (long)iVar11 / (long)iVar12 & 0xffffffffU) / (long)iVar10);
    }
    Mat::reshape(&local_60,bottom_blob,iVar10,iVar12,iVar7,opt->blob_allocator);
    if (&local_60 != top_blob) {
      if (local_60.refcount != (int *)0x0) {
        LOCK();
        *local_60.refcount = *local_60.refcount + 1;
        UNLOCK();
      }
      piVar5 = top_blob->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 8))();
          }
        }
      }
      top_blob->data = local_60.data;
      top_blob->refcount = local_60.refcount;
      top_blob->elemsize = local_60.elemsize;
      top_blob->allocator = local_60.allocator;
      top_blob->dims = local_60.dims;
      top_blob->w = local_60.w;
      top_blob->h = local_60.h;
      top_blob->c = local_60.c;
      top_blob->cstep = local_60.cstep;
    }
    if (local_60.refcount == (int *)0x0) goto LAB_0011abdd;
    LOCK();
    *local_60.refcount = *local_60.refcount + -1;
    UNLOCK();
    if (*local_60.refcount != 0) goto LAB_0011abdd;
    if (local_60.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_60.allocator + 8))();
      goto LAB_0011abdd;
    }
  }
  else if (iVar7 == 2) {
    if (this->w != 0) {
      iVar10 = this->w;
    }
    if (this->h != 0) {
      iVar12 = this->h;
    }
    if (iVar10 == -1) {
      iVar10 = iVar11 / iVar12;
    }
    if (iVar12 == -1) {
      iVar12 = iVar11 / iVar10;
    }
    Mat::reshape(&local_60,bottom_blob,iVar10,iVar12,opt->blob_allocator);
    if (&local_60 != top_blob) {
      if (local_60.refcount != (int *)0x0) {
        LOCK();
        *local_60.refcount = *local_60.refcount + 1;
        UNLOCK();
      }
      piVar5 = top_blob->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 8))();
          }
        }
      }
      top_blob->data = local_60.data;
      top_blob->refcount = local_60.refcount;
      top_blob->elemsize = local_60.elemsize;
      top_blob->allocator = local_60.allocator;
      top_blob->dims = local_60.dims;
      top_blob->w = local_60.w;
      top_blob->h = local_60.h;
      top_blob->c = local_60.c;
      top_blob->cstep = local_60.cstep;
    }
    if (local_60.refcount == (int *)0x0) goto LAB_0011abdd;
    LOCK();
    *local_60.refcount = *local_60.refcount + -1;
    UNLOCK();
    if (*local_60.refcount != 0) goto LAB_0011abdd;
    if (local_60.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_60.allocator + 8))();
      goto LAB_0011abdd;
    }
  }
  else {
    if (iVar7 != 1) goto LAB_0011abdd;
    if (this->w != 0) {
      iVar10 = this->w;
    }
    if (iVar10 == -1) {
      iVar10 = iVar11;
    }
    if (this->permute == 1) {
      sVar3 = bottom_blob->elemsize;
      pAVar4 = opt->blob_allocator;
      if ((((top_blob->dims == 1) && (top_blob->w == iVar10)) && (top_blob->elemsize == sVar3)) &&
         (top_blob->allocator == pAVar4)) {
        puVar8 = (undefined4 *)top_blob->data;
        if (puVar8 == (undefined4 *)0x0) {
          return -100;
        }
      }
      else {
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(*(void **)((long)top_blob->data + -8));
              }
            }
            else {
              (**(code **)(*(long *)top_blob->allocator + 8))();
            }
          }
        }
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->elemsize = sVar3;
        top_blob->allocator = pAVar4;
        top_blob->dims = 1;
        top_blob->w = iVar10;
        top_blob->h = 1;
        top_blob->c = 1;
        top_blob->cstep = (long)iVar10;
        if (iVar10 == 0) {
          return -100;
        }
        uVar14 = sVar3 * (long)iVar10 + 3 & 0xfffffffffffffffc;
        if (pAVar4 == (Allocator *)0x0) {
          pvVar9 = malloc(uVar14 + 0x1c);
          puVar8 = (undefined4 *)((long)pvVar9 + 0x17U & 0xfffffffffffffff0);
          *(void **)(puVar8 + -2) = pvVar9;
        }
        else {
          puVar8 = (undefined4 *)(*(code *)**(undefined8 **)pAVar4)(pAVar4,uVar14 + 4);
        }
        top_blob->data = puVar8;
        top_blob->refcount = (int *)((long)puVar8 + uVar14);
        *(undefined4 *)((long)puVar8 + uVar14) = 1;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      iVar10 = bottom_blob->h;
      if (0 < iVar10) {
        uVar1 = bottom_blob->w;
        uVar2 = bottom_blob->c;
        iVar12 = 0;
        do {
          if (0 < (int)uVar1) {
            puVar13 = (undefined4 *)((long)(bottom_blob->w * iVar12) * 4 + (long)bottom_blob->data);
            sVar3 = bottom_blob->cstep;
            sVar6 = bottom_blob->elemsize;
            uVar14 = 0;
            do {
              uVar15 = (ulong)uVar2;
              puVar16 = puVar13;
              if (0 < (int)uVar2) {
                do {
                  *puVar8 = *puVar16;
                  puVar8 = puVar8 + 1;
                  puVar16 = (undefined4 *)((long)puVar16 + sVar3 * sVar6);
                  uVar15 = uVar15 - 1;
                } while (uVar15 != 0);
              }
              uVar14 = uVar14 + 1;
              puVar13 = puVar13 + 1;
            } while (uVar14 != uVar1);
          }
          iVar12 = iVar12 + 1;
        } while (iVar12 != iVar10);
      }
      goto LAB_0011abdd;
    }
    Mat::reshape(&local_60,bottom_blob,iVar10,opt->blob_allocator);
    if (&local_60 != top_blob) {
      if (local_60.refcount != (int *)0x0) {
        LOCK();
        *local_60.refcount = *local_60.refcount + 1;
        UNLOCK();
      }
      piVar5 = top_blob->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 8))();
          }
        }
      }
      top_blob->data = local_60.data;
      top_blob->refcount = local_60.refcount;
      top_blob->elemsize = local_60.elemsize;
      top_blob->allocator = local_60.allocator;
      top_blob->dims = local_60.dims;
      top_blob->w = local_60.w;
      top_blob->h = local_60.h;
      top_blob->c = local_60.c;
      top_blob->cstep = local_60.cstep;
    }
    if (local_60.refcount == (int *)0x0) goto LAB_0011abdd;
    LOCK();
    *local_60.refcount = *local_60.refcount + -1;
    UNLOCK();
    if (*local_60.refcount != 0) goto LAB_0011abdd;
    if (local_60.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_60.allocator + 8))();
      goto LAB_0011abdd;
    }
  }
  if (local_60.data != (void *)0x0) {
    free(*(void **)((long)local_60.data + -8));
  }
LAB_0011abdd:
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    return 0;
  }
  return -100;
}

Assistant:

int Reshape::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    size_t elemsize = bottom_blob.elemsize;
    int total = bottom_blob.w * bottom_blob.h * bottom_blob.c;

    if (ndim == 1)
    {
        int _w = w;

        if (_w == 0)
            _w = bottom_blob.w;

        if (_w == -1)
            _w = total;

        if (permute == 1)
        {
            top_blob.create(_w, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            // c-h-w to h-w-c
            float* ptr = top_blob;
            for (int i=0; i<bottom_blob.h; i++)
            {
                for (int j=0; j<bottom_blob.w; j++)
                {
                    for (int p=0; p<bottom_blob.c; p++)
                    {
                        const float* bptr = bottom_blob.channel(p);
                        *ptr++ = bptr[i*bottom_blob.w + j];
                    }
                }
            }
        }
        else
        {
            top_blob = bottom_blob.reshape(_w, opt.blob_allocator);
        }
    }
    else if (ndim == 2)
    {
        int _w = w;
        int _h = h;

        if (_w == 0)
            _w = bottom_blob.w;
        if (_h == 0)
            _h = bottom_blob.h;

        if (_w == -1)
            _w = total / _h;
        if (_h == -1)
            _h = total / _w;

        top_blob = bottom_blob.reshape(_w, _h, opt.blob_allocator);
    }
    else if (ndim == 3)
    {
        int _w = w;
        int _h = h;
        int _c = c;

        if (_w == 0)
            _w = bottom_blob.w;
        if (_h == 0)
            _h = bottom_blob.h;
        if (_c == 0)
            _c = bottom_blob.c;

        if (_w == -1)
            _w = total / _c / _h;
        if (_h == -1)
            _h = total / _c / _w;
        if (_c == -1)
            _c = total / _h / _w;

        top_blob = bottom_blob.reshape(_w, _h, _c, opt.blob_allocator);
    }

    if (top_blob.empty())
        return -100;

    return 0;
}